

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

poptContext poptGetContext(char *name,int argc,char **argv,poptOption *options,uint flags)

{
  poptContext con;
  poptArgv ppcVar1;
  char *pcVar2;
  size_t sVar3;
  poptContext extraout_RAX;
  poptContext extraout_RAX_00;
  poptContext opt;
  uint uVar4;
  long *plVar5;
  poptContext con_00;
  undefined8 in_R9;
  ulong uVar6;
  size_t __nmemb;
  
  con = (poptContext)malloc(800);
  if (con == (poptContext)0x0) {
    con = (poptContext)0x0;
  }
  else {
    memset(con,0,800);
    con->os = (optionStackEntry *)con;
    con->optionStack[0].argc = argc;
    con->optionStack[0].argv = argv;
    con->optionStack[0].argb = (pbm_set *)0x0;
    if ((flags & 2) == 0) {
      con->optionStack[0].next = 1;
    }
    __nmemb = (size_t)(argc + 1);
    ppcVar1 = (poptArgv)calloc(__nmemb,8);
    con->leftovers = ppcVar1;
    con->allocLeftovers = argc + 1;
    con->options = options;
    con->aliases = (poptItem)0x0;
    con->numAliases = 0;
    con->flags = flags;
    con->execs = (poptItem)0x0;
    con->numExecs = 0;
    con->execFail = (char *)0x0;
    uVar4 = argc * 2;
    uVar6 = (ulong)uVar4;
    con->finalArgvAlloced = uVar4;
    plVar5 = (long *)0x8;
    ppcVar1 = (poptArgv)calloc((long)(int)uVar4,8);
    con->finalArgv = ppcVar1;
    con->execAbsolute = 1;
    con->arg_strip = (pbm_set *)0x0;
    pcVar2 = getenv("POSIXLY_CORRECT");
    if ((pcVar2 != (char *)0x0) || (pcVar2 = getenv("POSIX_ME_HARDER"), pcVar2 != (char *)0x0)) {
      con->flags = flags | 4;
    }
    if (name != (char *)0x0) {
      sVar3 = strlen(name);
      con_00 = (poptContext)(sVar3 + 1);
      pcVar2 = (char *)malloc((size_t)con_00);
      if (pcVar2 == (char *)0x0) {
        poptGetContext_cold_1();
        opt = extraout_RAX;
        if (plVar5 != (long *)0x0) {
          for (; ((*plVar5 != 0 || ((char)plVar5[1] != '\0')) || (plVar5[2] != 0));
              plVar5 = plVar5 + 6) {
            opt = (poptContext)plVar5[2];
            if (opt != (poptContext)0x0) {
              uVar4 = _poptArgMask & *(uint *)((long)plVar5 + 0xc);
              if (uVar4 == 5) {
                if ((int)*(uint *)((long)plVar5 + 0xc) < 0) {
                  opt = (poptContext)
                        (*(code *)opt)(con_00,0,0,0,plVar5[4],in_R9,con,uVar6,__nmemb,name,options);
                }
              }
              else if (uVar4 == 4) {
                if (opt == (poptContext)poptHelpOptions) {
                  opt = (poptContext)poptHelpOptionsI18N;
                }
                invokeCallbacksPRE(con_00,(poptOption *)opt);
                opt = extraout_RAX_00;
              }
            }
          }
        }
        return opt;
      }
      strcpy(pcVar2,name);
      con->appName = pcVar2;
    }
    invokeCallbacksPRE(con,options);
  }
  return con;
}

Assistant:

poptContext poptGetContext(const char * name, int argc, const char ** argv,
			const struct poptOption * options, unsigned int flags)
{
    poptContext con = malloc(sizeof(*con));

    if (con == NULL) return NULL;	/* XXX can't happen */
    memset(con, 0, sizeof(*con));

    con->os = con->optionStack;
    con->os->argc = argc;
    con->os->argv = argv;
    con->os->argb = NULL;

    if (!(flags & POPT_CONTEXT_KEEP_FIRST))
	con->os->next = 1;		/* skip argv[0] */

    con->leftovers = calloc( (size_t)(argc + 1), sizeof(*con->leftovers) );
    con->allocLeftovers = argc + 1;
    con->options = options;
    con->aliases = NULL;
    con->numAliases = 0;
    con->flags = flags;
    con->execs = NULL;
    con->numExecs = 0;
    con->execFail = NULL;
    con->finalArgvAlloced = argc * 2;
    con->finalArgv = calloc( (size_t)con->finalArgvAlloced, sizeof(*con->finalArgv) );
    con->execAbsolute = 1;
    con->arg_strip = NULL;

    if (getenv("POSIXLY_CORRECT") || getenv("POSIX_ME_HARDER"))
	con->flags |= POPT_CONTEXT_POSIXMEHARDER;

    if (name)
	con->appName = xstrdup(name);

    invokeCallbacksPRE(con, con->options);

    return con;
}